

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# strhelper.c
# Opt level: O1

char * copy_cstring_with_length(char *str,size_t *length)

{
  size_t sVar1;
  char *__dest;
  
  sVar1 = strlen(str);
  *length = sVar1;
  __dest = (char *)alloc_mem(sVar1 + 1);
  if (__dest == (char *)0x0) {
    __dest = (char *)0x0;
  }
  else {
    memcpy(__dest,str,*length);
    __dest[*length] = '\0';
  }
  return __dest;
}

Assistant:

char *
copy_cstring_with_length( const char *str, size_t *length ) {
  char *new_string;

  *length = strlen( str );

  new_string = alloc_mem( *length + 1 );
  if( !new_string ) {
    return NULL;
  }

  memcpy( new_string, str, *length );
  new_string[*length] = '\0';

  return new_string;
}